

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.c
# Opt level: O2

int http_parser_parse_url_(char *buf,size_t buflen,int is_connect,http_parser_url *u)

{
  uint16_t *puVar1;
  byte bVar2;
  ushort uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint16_t uVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  state s;
  uint local_4c;
  
  u->field_set = 0;
  u->port = 0;
  s = (uint)(is_connect != 0) * 4 + s_req_spaces_before_url;
  uVar10 = 7;
  uVar6 = 0;
  local_4c = 0;
  for (lVar8 = 0; buf + lVar8 < buf + buflen; lVar8 = lVar8 + 1) {
    s = parse_url_char_(s,buf[lVar8]);
    switch(s) {
    case s_dead:
      goto switchD_00149991_caseD_1;
    default:
      __assert_fail("!\"Unexpected state\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/http_parser/http_parser.c"
                    ,0x84a,
                    "int http_parser_parse_url_(const char *, size_t, int, struct http_parser_url *)"
                   );
    case s_req_schema:
      uVar5 = 0;
      break;
    case s_req_schema_slash:
    case s_req_schema_slash_slash:
    case s_req_server_start:
    case s_req_query_string_start:
    case s_req_fragment_start:
      goto switchD_00149991_caseD_15;
    case s_req_server:
      uVar5 = 1;
      break;
    case s_req_server_with_at:
      uVar5 = 1;
      local_4c = uVar5;
      break;
    case s_req_path:
      uVar5 = 3;
      break;
    case s_req_query_string:
      uVar5 = 4;
      break;
    case s_req_fragment:
      uVar5 = 5;
    }
    if (uVar5 == uVar10) {
      puVar1 = &u->field_data[uVar10].len;
      *puVar1 = *puVar1 + 1;
    }
    else {
      u->field_data[uVar5].off = (uint16_t)lVar8;
      u->field_data[uVar5].len = 1;
      uVar6 = uVar6 | 1 << uVar5;
      u->field_set = (uint16_t)uVar6;
      uVar10 = uVar5;
    }
switchD_00149991_caseD_15:
  }
  if ((uVar6 & 3) != 0) {
    uVar4 = (ulong)u->field_data[1].off;
    uVar3 = u->field_data[1].len;
    u->field_data[1].len = 0;
    iVar9 = (uint)(local_4c == 0) * 2 + 2;
    lVar8 = uVar3 + uVar4;
    uVar7 = 0;
    for (; buf + uVar4 < buf + lVar8; uVar4 = uVar4 + 1) {
      bVar2 = buf[uVar4];
      if (bVar2 == 0x5b) {
        iVar9 = 5;
      }
      else {
        if ((9 < (byte)(bVar2 - 0x30)) && (0x19 < (byte)((bVar2 | 0x20) + 0x9f))) {
          if (0x32 < bVar2 - 0x2d) {
            return 1;
          }
          if ((0x4000000000003U >> ((ulong)(bVar2 - 0x2d) & 0x3f) & 1) == 0) {
            return 1;
          }
        }
        u->field_data[1].off = (uint16_t)uVar4;
        uVar7 = uVar7 + 1;
        u->field_data[1].len = uVar7;
        iVar9 = 6;
      }
    }
    if ((iVar9 - 2U < 8) && ((0xafU >> (iVar9 - 2U & 0x1f) & 1) != 0)) {
      return 1;
    }
  }
  if (is_connect == 0) {
    if ((uVar6 & 4) == 0) {
      return 0;
    }
  }
  else if ((short)uVar6 != 6) goto LAB_00149ca8;
  uVar4 = strtoul(buf + u->field_data[2].off,(char **)0x0,10);
  if (uVar4 < 0x10000) {
    u->port = (uint16_t)uVar4;
    return 0;
  }
LAB_00149ca8:
  s = s_dead;
switchD_00149991_caseD_1:
  return s;
}

Assistant:

int
http_parser_parse_url_(const char *buf, size_t buflen, int is_connect,
                      struct http_parser_url *u)
{
  enum state s;
  const char *p;
  enum http_parser_url_fields uf, old_uf;
  int found_at = 0;

  u->port = u->field_set = 0;
  s = is_connect ? s_req_server_start : s_req_spaces_before_url;
  uf = old_uf = UF_MAX;

  for (p = buf; p < buf + buflen; p++) {
    s = parse_url_char_(s, *p);

    /* Figure out the next field that we're operating on */
    switch (s) {
      case s_dead:
        return 1;

      /* Skip delimeters */
      case s_req_schema_slash:
      case s_req_schema_slash_slash:
      case s_req_server_start:
      case s_req_query_string_start:
      case s_req_fragment_start:
        continue;

      case s_req_schema:
        uf = UF_SCHEMA;
        break;

      case s_req_server_with_at:
        found_at = 1;

      /* FALLTROUGH */
      case s_req_server:
        uf = UF_HOST;
        break;

      case s_req_path:
        uf = UF_PATH;
        break;

      case s_req_query_string:
        uf = UF_QUERY;
        break;

      case s_req_fragment:
        uf = UF_FRAGMENT;
        break;

      default:
        assert(!"Unexpected state");
        return 1;
    }

    /* Nothing's changed; soldier on */
    if (uf == old_uf) {
      u->field_data[uf].len++;
      continue;
    }

    u->field_data[uf].off = p - buf;
    u->field_data[uf].len = 1;

    u->field_set |= (1 << uf);
    old_uf = uf;
  }

  /* host must be present if there is a schema */
  /* parsing http:///toto will fail */
  if ((u->field_set & ((1 << UF_SCHEMA) | (1 << UF_HOST))) != 0) {
    if (http_parse_host_(buf, u, found_at) != 0) {
      return 1;
    }
  }

  /* CONNECT requests can only contain "hostname:port" */
  if (is_connect && u->field_set != ((1 << UF_HOST)|(1 << UF_PORT))) {
    return 1;
  }

  if (u->field_set & (1 << UF_PORT)) {
    /* Don't bother with endp; we've already validated the string */
    unsigned long v = strtoul(buf + u->field_data[UF_PORT].off, NULL, 10);

    /* Ports have a max value of 2^16 */
    if (v > 0xffff) {
      return 1;
    }

    u->port = (uint16_t) v;
  }

  return 0;
}